

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSimulationIslandManager.cpp
# Opt level: O1

void __thiscall
btSimulationIslandManager::updateActivationState
          (btSimulationIslandManager *this,btCollisionWorld *colWorld,btDispatcher *dispatcher)

{
  btCollisionObject **ppbVar1;
  btCollisionObject *pbVar2;
  long lVar3;
  long lVar4;
  btDispatcher *pbVar5;
  
  lVar3 = (long)(colWorld->m_collisionObjects).m_size;
  if (lVar3 < 1) {
    pbVar5 = (btDispatcher *)0x0;
  }
  else {
    ppbVar1 = (colWorld->m_collisionObjects).m_data;
    lVar4 = 0;
    pbVar5 = (btDispatcher *)0x0;
    do {
      pbVar2 = ppbVar1[lVar4];
      if ((pbVar2->m_collisionFlags & 3) == 0) {
        pbVar2->m_islandTag1 = (int)pbVar5;
        pbVar5 = (btDispatcher *)(ulong)((int)pbVar5 + 1);
      }
      pbVar2->m_companionId = -1;
      pbVar2->m_hitFraction = 1.0;
      lVar4 = lVar4 + 1;
    } while (lVar3 != lVar4);
  }
  btUnionFind::reset(&this->m_unionFind,(int)pbVar5);
  findUnions(this,pbVar5,colWorld);
  return;
}

Assistant:

void   btSimulationIslandManager::updateActivationState(btCollisionWorld* colWorld,btDispatcher* dispatcher)
{

	// put the index into m_controllers into m_tag   
	int index = 0;
	{

		int i;
		for (i=0;i<colWorld->getCollisionObjectArray().size(); i++)
		{
			btCollisionObject*   collisionObject= colWorld->getCollisionObjectArray()[i];
			//Adding filtering here
			if (!collisionObject->isStaticOrKinematicObject())
			{
				collisionObject->setIslandTag(index++);
			}
			collisionObject->setCompanionId(-1);
			collisionObject->setHitFraction(btScalar(1.));
		}
	}
	// do the union find

	initUnionFind( index );

	findUnions(dispatcher,colWorld);
}